

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O3

bool slang::parsing::isSameToken(Token left,Token right)

{
  int iVar1;
  size_t sVar2;
  Trivia *this;
  Trivia *this_00;
  short in_DX;
  size_type sVar3;
  size_type __rlen;
  short in_DI;
  size_type __rlen_1;
  iterator lit;
  long lVar4;
  string_view sVar5;
  string_view sVar6;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar7;
  Token local_50;
  Token local_40;
  
  if (in_DI == in_DX) {
    sVar5 = Token::rawText(&local_40);
    sVar2 = sVar5._M_len;
    sVar6 = Token::rawText(&local_50);
    if ((sVar2 == sVar6._M_len) &&
       ((sVar2 == 0 || (iVar1 = bcmp(sVar5._M_str,sVar6._M_str,sVar2), iVar1 == 0)))) {
      sVar7 = Token::trivia(&local_40);
      sVar3 = sVar7.size_;
      this = sVar7.data_;
      sVar7 = Token::trivia(&local_50);
      this_00 = sVar7.data_;
      if (sVar3 == sVar7.size_) {
        if (sVar3 == 0) {
          return true;
        }
        lVar4 = sVar3 << 4;
        while (this->kind == this_00->kind) {
          sVar5 = Trivia::getRawText(this);
          sVar2 = sVar5._M_len;
          sVar6 = Trivia::getRawText(this_00);
          if (sVar2 != sVar6._M_len) {
            return false;
          }
          if ((sVar2 != 0) && (iVar1 = bcmp(sVar5._M_str,sVar6._M_str,sVar2), iVar1 != 0)) {
            return false;
          }
          this = this + 1;
          this_00 = this_00 + 1;
          lVar4 = lVar4 + -0x10;
          if (lVar4 == 0) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool isSameToken(Token left, Token right) {
    if (left.kind != right.kind || left.rawText() != right.rawText())
        return false;

    auto lt = left.trivia();
    auto rt = right.trivia();
    if (lt.size() != rt.size())
        return false;

    for (auto lit = lt.begin(), rit = rt.begin(); lit != lt.end(); lit++, rit++) {
        if (lit->kind != rit->kind || lit->getRawText() != rit->getRawText())
            return false;
    }
    return true;
}